

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::percolateUp
          (Heap<Glucose::SimpSolver::ElimLt> *this,int i)

{
  int x;
  int iVar1;
  bool bVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  
  piVar3 = (this->heap).data;
  x = piVar3[i];
  while( true ) {
    if (i == 0) break;
    iVar5 = i + -1 >> 1;
    bVar2 = SimpSolver::ElimLt::operator()(&this->lt,x,piVar3[iVar5]);
    piVar3 = (this->heap).data;
    piVar4 = (this->indices).data;
    if (!bVar2) goto LAB_00113d18;
    iVar1 = piVar3[iVar5];
    piVar3[i] = iVar1;
    piVar4[iVar1] = i;
    i = iVar5;
  }
  piVar4 = (this->indices).data;
LAB_00113d18:
  piVar3[i] = x;
  piVar4[x] = i;
  return;
}

Assistant:

void percolateUp(int i)
    {
        int x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }